

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O1

TiXmlString operator+(char *a,TiXmlString *b)

{
  size_t len;
  long *in_RDX;
  
  *(Rep **)a = &TiXmlString::nullrep_;
  len = strlen((char *)b);
  TiXmlString::reserve((TiXmlString *)a,*(long *)*in_RDX + len);
  TiXmlString::append((TiXmlString *)a,(char *)b,len);
  TiXmlString::append((TiXmlString *)a,(char *)((size_type *)*in_RDX + 2),*(size_type *)*in_RDX);
  return (TiXmlString)(Rep *)a;
}

Assistant:

TiXmlString operator + (const char* a, const TiXmlString & b)
{
	TiXmlString tmp;
	TiXmlString::size_type a_len = static_cast<TiXmlString::size_type>( strlen(a) );
	tmp.reserve(a_len + b.length());
	tmp.append(a, a_len);
	tmp += b;
	return tmp;
}